

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec.h
# Opt level: O2

void __thiscall
Minisat::vec<Minisat::vec<Minisat::Watcher>_>::capacity
          (vec<Minisat::vec<Minisat::Watcher>_> *this,int min_cap)

{
  uint uVar1;
  vec<Minisat::Watcher> *pvVar2;
  int *piVar3;
  undefined8 uVar4;
  uint uVar5;
  uint uVar6;
  
  uVar1 = this->cap;
  if ((int)uVar1 < min_cap) {
    uVar6 = (min_cap - uVar1) + 1 & 0xfffffffe;
    uVar5 = ((int)uVar1 >> 1 & 0xfffffffeU) + 2;
    if ((int)uVar5 <= (int)uVar6) {
      uVar5 = uVar6;
    }
    if ((int)(uVar1 ^ 0x7fffffff) < (int)uVar5) {
LAB_00123ef0:
      uVar4 = __cxa_allocate_exception(1);
      __cxa_throw(uVar4,&OutOfMemoryException::typeinfo,0);
    }
    pvVar2 = (vec<Minisat::Watcher> *)realloc(this->data,(long)(int)(uVar1 + uVar5) << 4);
    if (pvVar2 == (vec<Minisat::Watcher> *)0x0) {
      piVar3 = __errno_location();
      if (*piVar3 == 0xc) goto LAB_00123ef0;
    }
    this->cap = this->cap + uVar5;
    this->data = pvVar2;
  }
  return;
}

Assistant:

void vec<T>::capacity(int min_cap)
{
    if (cap >= min_cap) return;
    int add = imax((min_cap - cap + 1) & ~1, ((cap >> 1) + 2) & ~1); // NOTE: grow by approximately 3/2
    if (add > INT_MAX - cap) throw OutOfMemoryException();

    T *newdata = (T *)::realloc(data, (cap + add) * sizeof(T));
    if (newdata == NULL && errno == ENOMEM) throw OutOfMemoryException();

    cap += add;
    data = newdata;
}